

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive.c
# Opt level: O2

void initmem(memory *m,int elemsize,int blocksize)

{
  int iVar1;
  void *pvVar2;
  
  iVar1 = 1000;
  if (1000 < blocksize) {
    iVar1 = blocksize;
  }
  m->blocksize = iVar1 * elemsize;
  pvVar2 = malloc((long)(iVar1 * elemsize));
  m->block[0] = pvVar2;
  m->allocnr = 0;
  m->nr = -1;
  m->current = (void *)0x0;
  m->first = (void *)0x0;
  m->last = (void *)0x0;
  return;
}

Assistant:

void initmem(memory *m, int elemsize, int blocksize)
{
   m->blocksize = MAX(blocksize, 1000) * elemsize;
   m->block[0] = malloc(m->blocksize);
   m->allocnr = 0;
   m->nr = -1;
   m->current = m->first = m->last = NULL;
}